

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O0

void __thiscall
SimplexTimer::initialiseSimplexClocks(SimplexTimer *this,HighsTimerClock *simplex_timer_clock)

{
  HighsInt HVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar6;
  long in_RSI;
  vector<int,_std::allocator<int>_> *clock;
  HighsTimer *timer_pointer;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,1);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,2);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,3);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,4);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,5);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,6);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,7);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,8);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,9);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,10);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xb);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xc);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xd);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xe);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0xf);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x10);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x11);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x12);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x18);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x19);
  *pvVar6 = HVar1;
  HVar1 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x13);
  *pvVar6 = HVar1;
  HVar2 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x14);
  *pvVar6 = HVar2;
  HVar3 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x15);
  *pvVar6 = HVar3;
  HVar4 = HighsTimer::clock_def
                    ((HighsTimer *)CONCAT44(in_stack_fffffffffffffef4,HVar3),
                     (char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x16);
  *pvVar6 = HVar4;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x17);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x22);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x1f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x20);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x21);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x23);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x24);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x25);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x26);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x27);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x28);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x29);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x2f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x30);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x31);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x32);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x33);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x34);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x35);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x36);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x37);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x38);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x39);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x3f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x40);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x41);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x42);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x43);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x44);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x45);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x46);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x47);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x48);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x49);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4a);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4b);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4c);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4d);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4e);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x4f);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x50);
  *pvVar6 = HVar5;
  HVar5 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x51);
  *pvVar6 = HVar5;
  HVar1 = HighsTimer::clock_def((HighsTimer *)CONCAT44(HVar4,HVar3),(char *)CONCAT44(HVar2,HVar1));
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,0x52);
  *pvVar6 = HVar1;
  return;
}

Assistant:

void initialiseSimplexClocks(HighsTimerClock& simplex_timer_clock) {
    HighsTimer* timer_pointer = simplex_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = simplex_timer_clock.clock_;
    clock.resize(SimplexNumClock);
    clock[SimplexTotalClock] = timer_pointer->clock_def("Simplex total");
    clock[SimplexIzDseWtClock] = timer_pointer->clock_def("Iz DSE Wt");
    clock[SimplexDualPhase1Clock] = timer_pointer->clock_def("Dual Phase 1");
    clock[SimplexDualPhase2Clock] = timer_pointer->clock_def("Dual Phase 2");
    clock[SimplexPrimalPhase1Clock] =
        timer_pointer->clock_def("Primal Phase 1");
    clock[SimplexPrimalPhase2Clock] =
        timer_pointer->clock_def("Primal Phase 2");
    clock[Group1Clock] = timer_pointer->clock_def("GROUP1");
    clock[IterateClock] = timer_pointer->clock_def("ITERATE");
    clock[IterateDualRebuildClock] = timer_pointer->clock_def("DUAL REBUILD");
    clock[IteratePrimalRebuildClock] =
        timer_pointer->clock_def("PRIMAL REBUILD");
    clock[IterateChuzrClock] = timer_pointer->clock_def("CHUZR");
    clock[IterateChuzcClock] = timer_pointer->clock_def("CHUZC");
    clock[IterateFtranClock] = timer_pointer->clock_def("FTRAN");
    clock[IterateVerifyClock] = timer_pointer->clock_def("VERIFY");
    clock[IterateDualClock] = timer_pointer->clock_def("DUAL");
    clock[IteratePrimalClock] = timer_pointer->clock_def("PRIMAL");
    clock[IterateDevexIzClock] = timer_pointer->clock_def("DEVEX_IZ");
    clock[IteratePivotsClock] = timer_pointer->clock_def("PIVOTS");
    clock[initialiseSimplexLpBasisAndFactorClock] =
        timer_pointer->clock_def("IZ_SIMPLEX_LP_DEF");
    clock[allocateSimplexArraysClock] =
        timer_pointer->clock_def("ALLOC_SIMPLEX_ARRS");
    clock[initialiseSimplexCostBoundsClock] =
        timer_pointer->clock_def("IZ_SIMPLEX_CO_BD");
    clock[ScaleClock] = timer_pointer->clock_def("SCALE");
    clock[CrashClock] = timer_pointer->clock_def("CRASH");
    clock[BasisConditionClock] = timer_pointer->clock_def("BASIS_CONDITION");
    clock[matrixSetupClock] = timer_pointer->clock_def("MATRIX_SETUP");
    clock[setNonbasicMoveClock] = timer_pointer->clock_def("SET_NONBASICMOVE");
    clock[DseIzClock] = timer_pointer->clock_def("DSE_IZ");
    clock[InvertClock] = timer_pointer->clock_def("INVERT");
    clock[PermWtClock] = timer_pointer->clock_def("PERM_WT");
    clock[ComputeDualClock] = timer_pointer->clock_def("COMPUTE_DUAL");
    clock[CorrectDualClock] = timer_pointer->clock_def("CORRECT_DUAL");
    clock[ComputePrimalClock] = timer_pointer->clock_def("COMPUTE_PRIMAL");
    clock[CollectPrIfsClock] = timer_pointer->clock_def("COLLECT_PR_IFS");
    clock[ComputePrIfsClock] = timer_pointer->clock_def("COMPUTE_PR_IFS");
    clock[ComputeDuIfsClock] = timer_pointer->clock_def("COMPUTE_DU_IFS");
    clock[ComputeDuObjClock] = timer_pointer->clock_def("COMPUTE_DU_OBJ");
    clock[ComputePrObjClock] = timer_pointer->clock_def("COMPUTE_PR_OBJ");
    clock[ReportRebuildClock] = timer_pointer->clock_def("REPORT_REBUILD");
    clock[ChuzrDualClock] = timer_pointer->clock_def("CHUZR_DUAL");
    clock[Chuzr1Clock] = timer_pointer->clock_def("CHUZR1");
    clock[Chuzr2Clock] = timer_pointer->clock_def("CHUZR2");
    clock[ChuzcPrimalClock] = timer_pointer->clock_def("CHUZC_PRIMAL");
    clock[ChuzcHyperInitialiselClock] =
        timer_pointer->clock_def("CHUZC_HYPER_IZ");
    clock[ChuzcHyperBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("CHUZC_HYPER_FEAS");
    clock[ChuzcHyperDualClock] = timer_pointer->clock_def("CHUZC_HYPER_DUAL");
    clock[ChuzcHyperClock] = timer_pointer->clock_def("CHUZC_HYPER");
    clock[Chuzc0Clock] = timer_pointer->clock_def("CHUZC0");
    clock[PriceChuzc1Clock] = timer_pointer->clock_def("PRICE_CHUZC1");
    clock[Chuzc1Clock] = timer_pointer->clock_def("CHUZC1");
    clock[Chuzc2Clock] = timer_pointer->clock_def("CHUZC2");
    clock[Chuzc3Clock] = timer_pointer->clock_def("CHUZC3");
    clock[Chuzc4Clock] = timer_pointer->clock_def("CHUZC4");
    clock[Chuzc4a0Clock] = timer_pointer->clock_def("CHUZC4a0");
    clock[Chuzc4a1Clock] = timer_pointer->clock_def("CHUZC4a1");
    clock[Chuzc4bClock] = timer_pointer->clock_def("CHUZC4b");
    clock[Chuzc4cClock] = timer_pointer->clock_def("CHUZC4c");
    clock[Chuzc4dClock] = timer_pointer->clock_def("CHUZC4d");
    clock[Chuzc4eClock] = timer_pointer->clock_def("CHUZC4e");
    clock[Chuzc5Clock] = timer_pointer->clock_def("CHUZC5");
    clock[DevexWtClock] = timer_pointer->clock_def("DEVEX_WT");
    clock[BtranClock] = timer_pointer->clock_def("BTRAN");
    clock[BtranBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("BTRAN_FEAS");
    clock[BtranFullClock] = timer_pointer->clock_def("BTRAN_FULL");
    clock[PriceClock] = timer_pointer->clock_def("PRICE");
    clock[PriceBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("PRICE_FEAS");
    clock[PriceFullClock] = timer_pointer->clock_def("PRICE_FULL");
    clock[FtranClock] = timer_pointer->clock_def("FTRAN");
    clock[FtranDseClock] = timer_pointer->clock_def("FTRAN_DSE");
    clock[BtranPseClock] = timer_pointer->clock_def("BTRAN_PSE");
    clock[FtranMixParClock] = timer_pointer->clock_def("FTRAN_MIX_PAR");
    clock[FtranMixFinalClock] = timer_pointer->clock_def("FTRAN_MIX_FINAL");
    clock[FtranBfrtClock] = timer_pointer->clock_def("FTRAN_BFRT");
    clock[UpdateRowClock] = timer_pointer->clock_def("UPDATE_ROW");
    clock[UpdateDualClock] = timer_pointer->clock_def("UPDATE_DUAL");
    clock[UpdateDualBasicFeasibilityChangeClock] =
        timer_pointer->clock_def("UPDATE_DUAL_FEAS");
    clock[UpdatePrimalClock] = timer_pointer->clock_def("UPDATE_PRIMAL");
    clock[DevexIzClock] = timer_pointer->clock_def("DEVEX_IZ");
    clock[DevexUpdateWeightClock] =
        timer_pointer->clock_def("UPDATE_DVX_WEIGHT");
    clock[DseUpdateWeightClock] = timer_pointer->clock_def("UPDATE_DSE_WEIGHT");
    clock[UpdatePivotsClock] = timer_pointer->clock_def("UPDATE_PIVOTS");
    clock[UpdateFactorClock] = timer_pointer->clock_def("UPDATE_FACTOR");
    clock[UpdateMatrixClock] = timer_pointer->clock_def("UPDATE_MATRIX");
    clock[UpdateRowEpClock] = timer_pointer->clock_def("UPDATE_ROW_EP");
  }